

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2f151d::ExpandedSpecialSubstitution::printLeft
          (ExpandedSpecialSubstitution *this,OutputStream *S)

{
  StringView local_68;
  StringView local_58;
  StringView local_48;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  ExpandedSpecialSubstitution *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  switch(*(undefined4 *)&(this->super_Node).field_0xc) {
  case 0:
    StringView::StringView
              (&local_28,"std::basic_string<char, std::char_traits<char>, std::allocator<char> >");
    OutputStream::operator+=(local_18,local_28);
    break;
  case 1:
  case 2:
    StringView::StringView
              (&local_38,"std::basic_string<char, std::char_traits<char>, std::allocator<char> >");
    OutputStream::operator+=(local_18,local_38);
    break;
  case 3:
    StringView::StringView(&local_48,"std::basic_istream<char, std::char_traits<char> >");
    OutputStream::operator+=(local_18,local_48);
    break;
  case 4:
    StringView::StringView(&local_58,"std::basic_ostream<char, std::char_traits<char> >");
    OutputStream::operator+=(local_18,local_58);
    break;
  case 5:
    StringView::StringView(&local_68,"std::basic_iostream<char, std::char_traits<char> >");
    OutputStream::operator+=(local_18,local_68);
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    switch (SSK) {
    case SpecialSubKind::allocator:
      S += "std::basic_string<char, std::char_traits<char>, "
           "std::allocator<char> >";
      break;
    case SpecialSubKind::basic_string:
    case SpecialSubKind::string:
      S += "std::basic_string<char, std::char_traits<char>, "
           "std::allocator<char> >";
      break;
    case SpecialSubKind::istream:
      S += "std::basic_istream<char, std::char_traits<char> >";
      break;
    case SpecialSubKind::ostream:
      S += "std::basic_ostream<char, std::char_traits<char> >";
      break;
    case SpecialSubKind::iostream:
      S += "std::basic_iostream<char, std::char_traits<char> >";
      break;
    }
  }